

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
StringEqualNoCaseFailure::StringEqualNoCaseFailure
          (StringEqualNoCaseFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          char *expected,char *actual,SimpleString *text)

{
  char cVar1;
  char cVar2;
  int iVar3;
  SimpleString *in_RDI;
  long in_R8;
  long in_R9;
  size_t failStart;
  DifferenceFormat in_stack_00000064;
  size_t in_stack_00000068;
  SimpleString *in_stack_00000070;
  TestFailure *in_stack_00000078;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  SimpleString *in_stack_ffffffffffffff58;
  SimpleString *in_stack_ffffffffffffff60;
  TestFailure *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  TestFailure *in_stack_ffffffffffffff98;
  TestFailure *in_stack_ffffffffffffffa0;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffffa0,(UtestShell *)in_stack_ffffffffffffff98,
             (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI->buffer_ = (char *)&PTR__StringEqualNoCaseFailure_001caca8;
  TestFailure::createUserText(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  SimpleString::operator=
            (in_RDI,(SimpleString *)
                    CONCAT17(in_stack_ffffffffffffff4f,
                             CONCAT16(in_stack_ffffffffffffff4e,
                                      CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
                            ));
  SimpleString::~SimpleString((SimpleString *)0x180beb);
  StringFromOrNull((char *)in_stack_ffffffffffffff58);
  StringFromOrNull((char *)in_stack_ffffffffffffff58);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SimpleString::operator+=
            (in_RDI,(SimpleString *)
                    CONCAT17(in_stack_ffffffffffffff4f,
                             CONCAT16(in_stack_ffffffffffffff4e,
                                      CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
                            ));
  SimpleString::~SimpleString((SimpleString *)0x180c4d);
  SimpleString::~SimpleString((SimpleString *)0x180c57);
  SimpleString::~SimpleString((SimpleString *)0x180c61);
  if ((in_R8 != 0) && (in_R9 != 0)) {
    do {
      cVar1 = SimpleString::ToLower('\0');
      iVar3 = (int)cVar1;
      cVar2 = SimpleString::ToLower('\0');
    } while (iVar3 == cVar2);
    SimpleString::SimpleString
              (in_RDI,(char *)CONCAT17(cVar1,CONCAT16(cVar2,CONCAT24(in_stack_ffffffffffffff4c,iVar3
                                                                    ))));
    TestFailure::createDifferenceAtPosString
              (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000064);
    SimpleString::operator+=
              (in_RDI,(SimpleString *)
                      CONCAT17(cVar1,CONCAT16(cVar2,CONCAT24(in_stack_ffffffffffffff4c,iVar3))));
    SimpleString::~SimpleString((SimpleString *)0x180dc0);
    SimpleString::~SimpleString((SimpleString *)0x180dca);
  }
  return;
}

Assistant:

StringEqualNoCaseFailure::StringEqualNoCaseFailure(UtestShell* test, const char* fileName, size_t lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromOrNull(expected), StringFromOrNull(actual));
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; SimpleString::ToLower(actual[failStart]) == SimpleString::ToLower(expected[failStart]); failStart++)
            ;
        message_ += createDifferenceAtPosString(actual, failStart);
    }
}